

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int HashmapFindValue(jx9_hashmap *pMap,jx9_value *pNeedle,jx9_hashmap_node **ppNode,int bStrict)

{
  jx9_vm *pjVar1;
  sxi32 iF1;
  sxi32 sVar2;
  uint iNest;
  sxu32 sVar3;
  jx9_hashmap_node *pjVar4;
  jx9_value *pSrc;
  jx9_value sNeedle;
  jx9_value sVal;
  anon_union_8_3_18420de5_for_x local_b8;
  undefined8 uStack_b0;
  jx9_vm *local_a8;
  jx9_vm *pjStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  anon_union_8_3_18420de5_for_x local_78;
  undefined8 uStack_70;
  jx9_vm *local_68;
  jx9_vm *pjStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_a8 = pMap->pVm;
  pjVar4 = pMap->pFirst;
  sVar3 = pMap->nEntry;
  uStack_40 = 0;
  local_78.rVal = 0.0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_70 = 0x20;
  uStack_80 = 0;
  local_b8.rVal = 0.0;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_b0 = 0x20;
  if (sVar3 != 0) {
    pjStack_a0 = local_a8;
    local_68 = local_a8;
    pjStack_60 = local_a8;
    do {
      pjVar1 = pjVar4->pMap->pVm;
      if (pjVar4->nValIdx < (pjVar1->aMemObj).nUsed) {
        pSrc = (jx9_value *)
               ((ulong)(pjVar4->nValIdx * (pjVar1->aMemObj).eSize) + (long)(pjVar1->aMemObj).pBase);
      }
      else {
        pSrc = (jx9_value *)0x0;
      }
      if (pSrc != (jx9_value *)0x0) {
        iNest = pNeedle->iFlags;
        if (((iNest | pSrc->iFlags) & 0x20) == 0) {
          jx9MemObjLoad(pSrc,(jx9_value *)&local_78);
          jx9MemObjLoad(pNeedle,(jx9_value *)&local_b8);
          sVar2 = jx9MemObjCmp((jx9_value *)&local_b8,(jx9_value *)&local_78,(int)ppNode,iNest);
          jx9MemObjRelease((jx9_value *)&local_78);
          jx9MemObjRelease((jx9_value *)&local_b8);
          if (sVar2 == 0) {
            return 0;
          }
        }
        else if (pSrc->iFlags == iNest) {
          return 0;
        }
      }
      pjVar4 = pjVar4->pPrev;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  return -6;
}

Assistant:

static int HashmapFindValue(
	jx9_hashmap *pMap,   /* Target hashmap */
	jx9_value *pNeedle,  /* Lookup key */
	jx9_hashmap_node **ppNode, /* OUT: target node on success  */
	int bStrict      /* TRUE for strict comparison */
	)
{
	jx9_hashmap_node *pEntry;
	jx9_value sVal, *pVal;
	jx9_value sNeedle;
	sxi32 rc;
	sxu32 n;
	/* Perform a linear search since we cannot sort the hashmap based on values */
	pEntry = pMap->pFirst;
	n = pMap->nEntry;
	jx9MemObjInit(pMap->pVm, &sVal);
	jx9MemObjInit(pMap->pVm, &sNeedle);
	for(;;){
		if( n < 1 ){
			break;
		}
		/* Extract node value */
		pVal = HashmapExtractNodeValue(pEntry);
		if( pVal ){
			if( (pVal->iFlags|pNeedle->iFlags) & MEMOBJ_NULL ){
				sxi32 iF1 = pVal->iFlags;
				sxi32 iF2 = pNeedle->iFlags;
				if( iF1 == iF2 ){
					/* NULL values are equals */
					if( ppNode ){
						*ppNode = pEntry;
					}
					return SXRET_OK;
				}
			}else{
				/* Duplicate value */
				jx9MemObjLoad(pVal, &sVal);
				jx9MemObjLoad(pNeedle, &sNeedle);
				rc = jx9MemObjCmp(&sNeedle, &sVal, bStrict, 0);
				jx9MemObjRelease(&sVal);
				jx9MemObjRelease(&sNeedle);
				if( rc == 0 ){
					if( ppNode ){
						*ppNode = pEntry;
					}
					/* Match found*/
					return SXRET_OK;
				}
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
		n--;
	}
	/* No such entry */
	return SXERR_NOTFOUND;
}